

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall
HFactor::setupGeneral
          (HFactor *this,HighsInt num_col_,HighsInt num_row_,HighsInt num_basic_,HighsInt *a_start_,
          HighsInt *a_index_,double *a_value_,HighsInt *basic_index_,double pivot_threshold_,
          double pivot_tolerance_,HighsInt highs_debug_level_,HighsLogOptions *log_options_,
          bool use_original_HFactor_logic_,HighsInt update_method_)

{
  int iVar1;
  double *pdVar2;
  void *__s;
  pointer pLVar3;
  reference pvVar4;
  int *piVar5;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  HVectorBase<double> *in_RDI;
  double in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined8 *in_stack_00000020;
  HighsInt row_link_dim;
  HighsInt row_link_max_count;
  HighsInt col_link_dim;
  HighsInt col_link_max_count;
  HighsInt mc_dim;
  HighsInt permute_max_dim;
  HighsInt counted;
  HighsInt i_1;
  HighsInt b_max_dim;
  HighsInt i;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff51;
  undefined1 uVar6;
  byte in_stack_ffffffffffffff52;
  byte in_stack_ffffffffffffff53;
  HighsInt in_stack_ffffffffffffff54;
  HighsInt size_;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 uVar12;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff80;
  vector<double,_std::allocator<double>_> *this_00;
  int local_64;
  int local_60;
  int local_58;
  double local_38;
  double local_30 [6];
  
  *(undefined4 *)
   &in_RDI[1].index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = in_EDX;
  *(undefined4 *)
   ((long)&in_RDI[1].index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = in_ESI;
  *(undefined4 *)
   &in_RDI[1].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = in_ECX;
  in_RDI[1].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(1.0 / (double)*(int *)&in_RDI[1].index.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage);
  *(undefined1 *)
   &in_RDI[1].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 1;
  in_RDI[1].synthetic_tick = in_R8;
  *(undefined8 *)&in_RDI[1].cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl = in_R9;
  *(undefined8 *)&in_RDI[1].cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8
       = in_stack_00000008;
  *(undefined8 *)&in_RDI[1].cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
       = in_stack_00000010;
  pdVar2 = std::min<double>(local_30,(double *)&kMaxPivotThreshold);
  pdVar2 = std::max<double>((double *)&kMinPivotThreshold,pdVar2);
  in_RDI[1].iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)*pdVar2;
  pdVar2 = std::min<double>(&local_38,&kMaxPivotTolerance);
  pdVar2 = std::max<double>(&kMinPivotTolerance,pdVar2);
  in_RDI[1].iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)*pdVar2;
  *(undefined4 *)
   &in_RDI[1].iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = in_stack_00000018;
  in_RDI[1].next = (HVectorBase<double> *)0x7ff0000000000000;
  __s = operator_new(8);
  memset(__s,0,8);
  std::unique_ptr<HFactor::LogData,std::default_delete<HFactor::LogData>>::
  unique_ptr<std::default_delete<HFactor::LogData>,void>
            ((unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)
             CONCAT44(in_stack_ffffffffffffff54,
                      CONCAT13(in_stack_ffffffffffffff53,
                               CONCAT12(in_stack_ffffffffffffff52,
                                        CONCAT11(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50
                                                )))),
             (pointer)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  std::unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_>::operator=
            ((unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)
             CONCAT44(in_stack_ffffffffffffff54,
                      CONCAT13(in_stack_ffffffffffffff53,
                               CONCAT12(in_stack_ffffffffffffff52,
                                        CONCAT11(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50
                                                )))),
             (unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  std::unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_>::~unique_ptr
            ((unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)in_RDI);
  pLVar3 = std::unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_>::operator->
                     ((unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)
                      0x7c8ba6);
  in_RDI[1].packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)pLVar3;
  pLVar3 = std::unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_>::operator->
                     ((unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)
                      0x7c8bbe);
  in_RDI[1].packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&pLVar3->log_to_console;
  pLVar3 = std::unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_>::operator->
                     ((unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)
                      0x7c8bda);
  in_RDI[1].packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&pLVar3->log_dev_level;
  if (in_stack_00000020 == (undefined8 *)0x0) {
    pLVar3 = std::unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_>::operator->
                       ((unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)
                        0x7c8c09);
    pLVar3->output_flag = false;
    pLVar3 = std::unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_>::operator->
                       ((unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)
                        0x7c8c1d);
    pLVar3->log_to_console = true;
    pLVar3 = std::unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_>::operator->
                       ((unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)
                        0x7c8c32);
    pLVar3->log_dev_level = 0;
    in_RDI[1].packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    in_stack_ffffffffffffff52 = *(byte *)in_stack_00000020[1];
    pLVar3 = std::unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_>::operator->
                       ((unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)
                        0x7c8c74);
    pLVar3->output_flag = (bool)(in_stack_ffffffffffffff52 & 1);
    in_stack_ffffffffffffff53 = *(byte *)in_stack_00000020[2];
    pLVar3 = std::unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_>::operator->
                       ((unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)
                        0x7c8ca0);
    pLVar3->log_to_console = (bool)(in_stack_ffffffffffffff53 & 1);
    in_stack_ffffffffffffff54 = *(HighsInt *)in_stack_00000020[3];
    pLVar3 = std::unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_>::operator->
                       ((unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)
                        0x7c8ccd);
    pLVar3->log_dev_level = in_stack_ffffffffffffff54;
    in_RDI[1].packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*in_stack_00000020;
  }
  *(byte *)&in_RDI[2].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (byte)row_link_max_count & 1;
  *(HighsInt *)&in_RDI[2].synthetic_tick = col_link_dim;
  std::vector<int,_std::allocator<int>_>::reserve
            (in_stack_ffffffffffffff80,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
            );
  std::vector<double,_std::allocator<double>_>::assign
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff54,
                      CONCAT13(in_stack_ffffffffffffff53,
                               CONCAT12(in_stack_ffffffffffffff52,
                                        CONCAT11(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50
                                                )))),
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (value_type_conflict1 *)0x7c8d50);
  *(undefined4 *)
   ((long)&in_RDI[2].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff54,
                      CONCAT13(in_stack_ffffffffffffff53,
                               CONCAT12(in_stack_ffffffffffffff52,
                                        CONCAT11(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50
                                                )))),
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (value_type_conflict2 *)0x7c8d87);
  for (local_58 = 0;
      local_58 <
      *(int *)((long)&in_RDI[1].index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 4); local_58 = local_58 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[2].cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         field_0x10,
                        (long)(*(int *)((long)in_RDI[1].synthetic_tick + (long)(local_58 + 1) * 4) -
                              *(int *)((long)in_RDI[1].synthetic_tick + (long)local_58 * 4)));
    *pvVar4 = *pvVar4 + 1;
  }
  piVar5 = std::max<int>((int *)&in_RDI[1].index.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (int *)&in_RDI[1].array);
  iVar1 = *piVar5;
  local_60 = *(int *)&in_RDI[1].index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
  local_64 = 0;
  while( true ) {
    size_ = (HighsInt)((ulong)__s >> 0x20);
    uVar6 = -1 < local_60 && local_64 < iVar1;
    if (-1 >= local_60 || local_64 >= iVar1) break;
    in_stack_ffffffffffffff4c = local_60;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[2].cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         field_0x10,(long)local_60);
    *(int *)((long)&in_RDI[2].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 4) =
         in_stack_ffffffffffffff4c * *pvVar4 +
         *(int *)((long)&in_RDI[2].array.super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage + 4);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[2].cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         field_0x10,(long)local_60);
    local_64 = *pvVar4 + local_64;
    local_60 = local_60 + -1;
  }
  *(int *)((long)&in_RDI[2].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 4) =
       iVar1 + *(int *)((long)&in_RDI[2].array.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_ffffffffffffff80,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
             ,(value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
  ;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::max<int>((int *)&in_RDI[1].index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(int *)&in_RDI[1].array);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<char,_std::allocator<char>_>::assign
            ((vector<char,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff54,
                      CONCAT13(in_stack_ffffffffffffff53,
                               CONCAT12(in_stack_ffffffffffffff52,
                                        CONCAT11(uVar6,in_stack_ffffffffffffff50)))),
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (value_type_conflict *)0x7c90ea);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  this_00 = (vector<double,_std::allocator<double>_> *)0x0;
  std::vector<double,_std::allocator<double>_>::assign
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff54,
                      CONCAT13(in_stack_ffffffffffffff53,
                               CONCAT12(in_stack_ffffffffffffff52,
                                        CONCAT11(uVar6,in_stack_ffffffffffffff50)))),
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (value_type_conflict1 *)0x7c912e);
  uVar12 = *(undefined4 *)
            &in_RDI[1].index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  uVar11 = *(undefined4 *)
            &in_RDI[1].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar10 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff54,
                      CONCAT13(in_stack_ffffffffffffff53,
                               CONCAT12(in_stack_ffffffffffffff52,
                                        CONCAT11(uVar6,in_stack_ffffffffffffff50)))),
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (value_type_conflict2 *)0x7c916a);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar10,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar10,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  uVar9 = *(undefined4 *)
           &in_RDI[1].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar8 = *(undefined4 *)
           &in_RDI[1].index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar10,uVar9),
             CONCAT44(uVar8,in_stack_ffffffffffffff68));
  uVar7 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff54,
                      CONCAT13(in_stack_ffffffffffffff53,
                               CONCAT12(in_stack_ffffffffffffff52,
                                        CONCAT11(uVar6,in_stack_ffffffffffffff50)))),
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (value_type_conflict2 *)0x7c91ed);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar10,uVar9),CONCAT44(uVar8,uVar7));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar10,uVar9),CONCAT44(uVar8,uVar7));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar10,uVar9),CONCAT44(uVar8,uVar7));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(uVar12,uVar11));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(uVar12,uVar11));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(uVar12,uVar11));
  std::vector<double,_std::allocator<double>_>::reserve(this_00,CONCAT44(uVar12,uVar11));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(uVar12,uVar11));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(uVar12,uVar11));
  std::vector<double,_std::allocator<double>_>::reserve(this_00,CONCAT44(uVar12,uVar11));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar10,uVar9),CONCAT44(uVar8,uVar7));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(uVar12,uVar11));
  std::vector<double,_std::allocator<double>_>::reserve(this_00,CONCAT44(uVar12,uVar11));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(uVar12,uVar11));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(uVar12,uVar11));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(uVar12,uVar11));
  std::vector<double,_std::allocator<double>_>::reserve(this_00,CONCAT44(uVar12,uVar11));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(uVar12,uVar11));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(uVar12,uVar11));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(uVar12,uVar11));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(uVar12,uVar11));
  std::vector<double,_std::allocator<double>_>::reserve(this_00,CONCAT44(uVar12,uVar11));
  std::vector<double,_std::allocator<double>_>::reserve(this_00,CONCAT44(uVar12,uVar11));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(uVar12,uVar11));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(uVar12,uVar11));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(uVar12,uVar11));
  std::vector<double,_std::allocator<double>_>::reserve(this_00,CONCAT44(uVar12,uVar11));
  HVectorBase<double>::setup(in_RDI,size_);
  *(undefined4 *)
   ((long)&in_RDI[9].packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0xffffffff;
  return;
}

Assistant:

void HFactor::setupGeneral(
    const HighsInt num_col_, const HighsInt num_row_, HighsInt num_basic_,
    const HighsInt* a_start_, const HighsInt* a_index_, const double* a_value_,
    HighsInt* basic_index_, const double pivot_threshold_,
    const double pivot_tolerance_, const HighsInt highs_debug_level_,
    const HighsLogOptions* log_options_, const bool use_original_HFactor_logic_,
    const HighsInt update_method_) {
  // Copy Problem size and (pointer to) coefficient matrix
  num_row = num_row_;
  num_col = num_col_;
  num_basic = num_basic_;
  inv_num_row = 1.0 / num_row;
  this->a_matrix_valid = true;
  a_start = a_start_;
  a_index = a_index_;
  a_value = a_value_;
  basic_index = basic_index_;
  pivot_threshold =
      max(kMinPivotThreshold, min(pivot_threshold_, kMaxPivotThreshold));
  pivot_tolerance =
      max(kMinPivotTolerance, min(pivot_tolerance_, kMaxPivotTolerance));
  highs_debug_level = highs_debug_level_;
  time_limit_ = kHighsInf;
  log_data = decltype(log_data)(new LogData());
  log_options.output_flag = &log_data->output_flag;
  log_options.log_to_console = &log_data->log_to_console;
  log_options.log_dev_level = &log_data->log_dev_level;

  if (!log_options_) {
    log_data->output_flag = false;
    log_data->log_to_console = true;
    log_data->log_dev_level = 0;
    log_options.log_stream = nullptr;
  } else {
    log_data->output_flag = *(log_options_->output_flag);
    log_data->log_to_console = *(log_options_->log_to_console);
    log_data->log_dev_level = *(log_options_->log_dev_level);
    log_options.log_stream = log_options_->log_stream;
  }

  use_original_HFactor_logic = use_original_HFactor_logic_;
  update_method = update_method_;

  // Allocate for working buffer
  iwork.reserve(num_row * 2);
  dwork.assign(num_row, 0);

  // Find Basis matrix limit size
  basis_matrix_limit_size = 0;

  iwork.assign(num_row + 1, 0);
  for (HighsInt i = 0; i < num_col; i++) iwork[a_start[i + 1] - a_start[i]]++;
  const HighsInt b_max_dim = max(num_row, num_basic);
  for (HighsInt i = num_row, counted = 0; i >= 0 && counted < b_max_dim; i--)
    basis_matrix_limit_size += i * iwork[i], counted += iwork[i];
  basis_matrix_limit_size += b_max_dim;

  // Allocate space for basis matrix, L, U factor and Update buffer
  b_var.resize(b_max_dim);
  b_start.resize(b_max_dim + 1, 0);
  b_index.resize(basis_matrix_limit_size);
  b_value.resize(basis_matrix_limit_size);

  // Allocate space for pivot records
  const HighsInt permute_max_dim = max(num_row, num_basic);
  permute.resize(permute_max_dim);

  // Allocate space for Markowitz matrices
  const HighsInt mc_dim = num_basic;
  mc_var.resize(mc_dim);
  mc_start.resize(mc_dim);
  mc_count_a.resize(mc_dim);
  mc_count_n.resize(mc_dim);
  mc_space.resize(mc_dim);
  mc_min_pivot.resize(mc_dim);
  mc_index.resize(basis_matrix_limit_size * kMCExtraEntriesMultiplier);
  mc_value.resize(basis_matrix_limit_size * kMCExtraEntriesMultiplier);

  mr_start.resize(num_row);
  mr_count.resize(num_row);
  mr_space.resize(num_row);
  mr_count_before.resize(num_row);
  mr_index.resize(basis_matrix_limit_size * kMRExtraEntriesMultiplier);

  mwz_column_mark.assign(num_row, 0);
  mwz_column_index.resize(num_row);
  mwz_column_array.assign(num_row, 0);

  // Allocate space for count-link-list
  const HighsInt col_link_max_count = num_row;
  const HighsInt col_link_dim = num_basic;
  col_link_first.assign(col_link_max_count + 1, -1);
  col_link_next.resize(col_link_dim);
  col_link_last.resize(col_link_dim);

  const HighsInt row_link_max_count = num_basic;
  const HighsInt row_link_dim = num_row;
  // Strictly not necessary, but nice if it's the right size
  row_link_first.resize(row_link_max_count + 1);
  row_link_first.assign(row_link_max_count + 1, -1);
  row_link_next.resize(row_link_dim);
  row_link_last.resize(row_link_dim);

  // Allocate space for L factor
  l_pivot_lookup.resize(num_row);
  l_pivot_index.reserve(num_row);
  l_start.reserve(num_row + 1);
  l_index.reserve(basis_matrix_limit_size * kLFactorExtraEntriesMultiplier);
  l_value.reserve(basis_matrix_limit_size * kLFactorExtraEntriesMultiplier);

  lr_start.reserve(num_row + 1);
  lr_index.reserve(basis_matrix_limit_size * kLFactorExtraEntriesMultiplier);
  lr_value.reserve(basis_matrix_limit_size * kLFactorExtraEntriesMultiplier);

  // Allocate space for U factor
  u_pivot_lookup.resize(num_row);
  u_pivot_index.reserve(num_row + kUFactorExtraVectors);
  u_pivot_value.reserve(num_row + kUFactorExtraVectors);

  u_start.reserve(num_row + kUFactorExtraVectors + 1);
  u_last_p.reserve(num_row + kUFactorExtraVectors);
  u_index.reserve(basis_matrix_limit_size * kUFactorExtraEntriesMultiplier);
  u_value.reserve(basis_matrix_limit_size * kUFactorExtraEntriesMultiplier);

  ur_start.reserve(num_row + kUFactorExtraVectors + 1);
  ur_lastp.reserve(num_row + kUFactorExtraVectors);
  ur_space.reserve(num_row + kUFactorExtraVectors);
  ur_index.reserve(basis_matrix_limit_size * kUFactorExtraEntriesMultiplier);
  ur_value.reserve(basis_matrix_limit_size * kUFactorExtraEntriesMultiplier);

  // Allocate spaces for Update buffer
  pf_pivot_value.reserve(kPFFPivotEntries);
  pf_pivot_index.reserve(kPFFPivotEntries);
  pf_start.reserve(kPFVectors + 1);
  pf_index.reserve(basis_matrix_limit_size * kPFEntriesMultiplier);
  pf_value.reserve(basis_matrix_limit_size * kPFEntriesMultiplier);

  // Set up the local HVector for use when RHS is
  // std::vector<double>.
  rhs_.setup(num_row);
  rhs_.count = -1;
}